

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

char * GetBailOutKindName(BailOutKind kind)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  BailOutKind e1;
  int iVar4;
  size_t sVar5;
  undefined4 *puVar6;
  uint offset;
  BailOutKind normalKind;
  size_t position;
  char *pcStack_10;
  BailOutKind kind_local;
  
  position._4_4_ = kind;
  BVar3 = IR::operator&(kind,BailOutKindBits);
  bVar2 = IR::operator!(BVar3);
  BVar3 = position._4_4_;
  if (bVar2) {
    pcStack_10 = BailOutKindNames[position._4_4_];
  }
  else {
    _offset = 0;
    e1 = IR::operator~(BailOutKindBits);
    BVar3 = IR::operator&(BVar3,e1);
    if (BVar3 != BailOutInvalid) {
      IR::operator-=((BailOutKind *)((long)&position + 4),BVar3);
      iVar4 = sprintf_s(GetBailOutKindName::name,0x200,"%s",BailOutKindNames[BVar3]);
      _offset = (size_t)iVar4;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutOnOverflow);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutOnOverflow);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,1);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutOnMulOverflow);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutOnMulOverflow);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,2);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutOnNegativeZero);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutOnNegativeZero);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,3);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutOnPowIntIntOverflow);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutOnPowIntIntOverflow);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,4);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutOnMissingValue);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutOnMissingValue);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,6);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutConventionalNativeArrayAccessOnly);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutConventionalNativeArrayAccessOnly);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,7);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutConvertedNativeArray);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutConvertedNativeArray);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,8);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutOnArrayAccessHelperCall);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutOnArrayAccessHelperCall);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,9);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutOnInvalidatedArrayHeadSegment);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutOnInvalidatedArrayHeadSegment);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,10);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutOnInvalidatedArrayLength);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutOnInvalidatedArrayLength);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,0xb);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOnStackArgsOutOfActualsRange);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOnStackArgsOutOfActualsRange);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,0xc);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutForceByFlag);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutForceByFlag);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,0xe);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutBreakPointInFunction);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutBreakPointInFunction);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,0xf);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutStackFrameBase);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutStackFrameBase);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,0x10);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutLocalValueChanged);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutLocalValueChanged);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,0x11);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutExplicit);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutExplicit);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,0x12);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutStep);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutStep);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,0x13);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutIgnoreException);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutIgnoreException);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,0x14);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutOnDivByZero);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutOnDivByZero);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,0x16);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutOnDivOfMinInt);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutOnDivOfMinInt);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,0x17);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,BailOutMarkTempObject);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),BailOutMarkTempObject);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,0x19);
      _offset = sVar5 + _offset;
    }
    BVar3 = IR::operator&(position._4_4_,LazyBailOut);
    if (BVar3 != BailOutInvalid) {
      IR::operator^=((BailOutKind *)((long)&position + 4),LazyBailOut);
      sVar5 = ConcatBailOutKindBits(GetBailOutKindName::name,0x200,_offset,0x1a);
      _offset = sVar5 + _offset;
    }
    if (_offset == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                         ,0xb65,"(position != 0)","position != 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar2 = IR::operator!(position._4_4_);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                         ,0xb66,"(!kind)","!kind");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pcStack_10 = GetBailOutKindName::name;
  }
  return pcStack_10;
}

Assistant:

const char* GetBailOutKindName(IR::BailOutKind kind)
{
    using namespace IR;

    if (!(kind & BailOutKindBits))
    {
        return BailOutKindNames[kind];
    }

    static char name[512];
    size_t position = 0;
    const auto normalKind = kind & ~BailOutKindBits;
    if (normalKind != 0)
    {
        kind -= normalKind;
        position +=
            sprintf_s(
                &name[position],
                sizeof(name) / sizeof(name[0]) - position * sizeof(name[0]),
                position == 0 ? "%s" : " | %s",
                BailOutKindNames[normalKind]);
    }

    uint offset = 1;
    if (kind & BailOutOnOverflow)
    {
        kind ^= BailOutOnOverflow;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnMulOverflow)
    {
        kind ^= BailOutOnMulOverflow;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnNegativeZero)
    {
        kind ^= BailOutOnNegativeZero;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnPowIntIntOverflow)
    {
        kind ^= BailOutOnPowIntIntOverflow;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    // BailOutOnResultConditions

    ++offset;
    if (kind & BailOutOnMissingValue)
    {
        kind ^= BailOutOnMissingValue;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutConventionalNativeArrayAccessOnly)
    {
        kind ^= BailOutConventionalNativeArrayAccessOnly;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutConvertedNativeArray)
    {
        kind ^= BailOutConvertedNativeArray;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnArrayAccessHelperCall)
    {
        kind ^= BailOutOnArrayAccessHelperCall;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnInvalidatedArrayHeadSegment)
    {
        kind ^= BailOutOnInvalidatedArrayHeadSegment;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnInvalidatedArrayLength)
    {
        kind ^= BailOutOnInvalidatedArrayLength;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOnStackArgsOutOfActualsRange)
    {
        kind ^= BailOnStackArgsOutOfActualsRange;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    // BailOutForArrayBits

    ++offset;
    if (kind & BailOutForceByFlag)
    {
        kind ^= BailOutForceByFlag;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutBreakPointInFunction)
    {
        kind ^= BailOutBreakPointInFunction;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutStackFrameBase)
    {
        kind ^= BailOutStackFrameBase;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutLocalValueChanged)
    {
        kind ^= BailOutLocalValueChanged;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutExplicit)
    {
        kind ^= BailOutExplicit;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutStep)
    {
        kind ^= BailOutStep;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutIgnoreException)
    {
        kind ^= BailOutIgnoreException;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    // BailOutForDebuggerBits

    ++offset;
    if (kind & BailOutOnDivByZero)
    {
        kind ^= BailOutOnDivByZero;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnDivOfMinInt)
    {
        kind ^= BailOutOnDivOfMinInt;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    // BailOutOnDivSrcConditions

    ++offset;
    if (kind & BailOutMarkTempObject)
    {
        kind ^= BailOutMarkTempObject;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;

    if (kind & LazyBailOut)
    {
        kind ^= LazyBailOut;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    // BailOutKindBits

    Assert(position != 0);
    Assert(!kind);
    return name;
}